

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtract_avx2.c
# Opt level: O0

void aom_subtract_block_avx2
               (int rows,int cols,int16_t *diff_ptr,ptrdiff_t diff_stride,uint8_t *src_ptr,
               ptrdiff_t src_stride,uint8_t *pred_ptr,ptrdiff_t pred_stride)

{
  undefined8 in_RCX;
  ptrdiff_t in_RDX;
  int in_ESI;
  undefined4 in_EDI;
  undefined8 in_R8;
  int16_t *in_R9;
  uint8_t *in_stack_00000010;
  uint8_t *in_stack_00000060;
  ptrdiff_t in_stack_00000068;
  int16_t *in_stack_00000070;
  int in_stack_0000007c;
  ptrdiff_t in_stack_ffffffffffffffc0;
  uint8_t *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  int rows_00;
  
  if (in_ESI == 0x10) {
    subtract_block_16xn_avx2
              (in_stack_0000007c,in_stack_00000070,in_stack_00000068,in_stack_00000060,pred_stride,
               pred_ptr,in_stack_ffffffffffffffc0);
  }
  else {
    rows_00 = (int)((ulong)in_R8 >> 0x20);
    if (in_ESI == 0x20) {
      subtract_block_32xn_avx2
                (rows_00,in_R9,CONCAT44(0x20,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8,
                 in_stack_ffffffffffffffc0,in_stack_00000010,in_RDX);
    }
    else if (in_ESI == 0x40) {
      subtract_block_64xn_avx2
                (rows_00,in_R9,CONCAT44(0x40,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8,
                 in_stack_ffffffffffffffc0,in_stack_00000010,in_RDX);
    }
    else if (in_ESI == 0x80) {
      subtract_block_128xn_avx2
                (rows_00,in_R9,CONCAT44(0x80,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8,
                 in_stack_ffffffffffffffc0,in_stack_00000010,in_RDX);
    }
    else {
      aom_subtract_block_sse2(in_EDI,in_ESI,in_RDX,in_RCX,in_R8,in_R9);
    }
  }
  return;
}

Assistant:

void aom_subtract_block_avx2(int rows, int cols, int16_t *diff_ptr,
                             ptrdiff_t diff_stride, const uint8_t *src_ptr,
                             ptrdiff_t src_stride, const uint8_t *pred_ptr,
                             ptrdiff_t pred_stride) {
  switch (cols) {
    case 16:
      subtract_block_16xn_avx2(rows, diff_ptr, diff_stride, src_ptr, src_stride,
                               pred_ptr, pred_stride);
      break;
    case 32:
      subtract_block_32xn_avx2(rows, diff_ptr, diff_stride, src_ptr, src_stride,
                               pred_ptr, pred_stride);
      break;
    case 64:
      subtract_block_64xn_avx2(rows, diff_ptr, diff_stride, src_ptr, src_stride,
                               pred_ptr, pred_stride);
      break;
    case 128:
      subtract_block_128xn_avx2(rows, diff_ptr, diff_stride, src_ptr,
                                src_stride, pred_ptr, pred_stride);
      break;
    default:
      aom_subtract_block_sse2(rows, cols, diff_ptr, diff_stride, src_ptr,
                              src_stride, pred_ptr, pred_stride);
      break;
  }
}